

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O1

void __thiscall
Js::FunctionBody::SetDefaultFunctionEntryPointInfo
          (FunctionBody *this,FunctionEntryPointInfo *entryPointInfo,
          JavascriptMethod originalEntryPoint)

{
  Type *addr;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  if (entryPointInfo == (FunctionEntryPointInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x402,"(entryPointInfo)","entryPointInfo");
    if (!bVar2) goto LAB_00765f36;
    *puVar3 = 0;
  }
  addr = &(this->super_ParseableFunctionInfo).super_FunctionProxy.m_defaultEntryPointInfo;
  Memory::Recycler::WBSetBit((char *)addr);
  (this->super_ParseableFunctionInfo).super_FunctionProxy.m_defaultEntryPointInfo.ptr =
       (ProxyEntryPointInfo *)entryPointInfo;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
  Memory::Recycler::WBSetBit((char *)&this->defaultFunctionEntryPointInfo);
  (this->defaultFunctionEntryPointInfo).ptr = entryPointInfo;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->defaultFunctionEntryPointInfo);
  if ((this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr ==
      (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0x4e3,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar2) goto LAB_00765f36;
    *puVar3 = 0;
  }
  if ((FunctionBody *)
      (((this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr)->functionBodyImpl)
      .ptr != this) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0x4e4,"(GetFunctionInfo()->GetFunctionProxy() == this)",
                                "GetFunctionInfo()->GetFunctionProxy() == this");
    if (!bVar2) {
LAB_00765f36:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  FunctionInfo::SetOriginalEntryPoint
            ((this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr,
             originalEntryPoint);
  return;
}

Assistant:

void FunctionBody::SetDefaultFunctionEntryPointInfo(FunctionEntryPointInfo* entryPointInfo, const JavascriptMethod originalEntryPoint)
    {
        Assert(entryPointInfo);

        // Need to set twice since ProxyEntryPointInfo cast points to an interior pointer
        this->m_defaultEntryPointInfo = (ProxyEntryPointInfo*) entryPointInfo;
        this->defaultFunctionEntryPointInfo = entryPointInfo;
        SetOriginalEntryPoint(originalEntryPoint);
    }